

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void moveto_node_add(lyxp_set *set,lyd_node *node,uint32_t pos,uint32_t i,int *replaced)

{
  int *replaced_local;
  uint32_t i_local;
  uint32_t pos_local;
  lyd_node *node_local;
  lyxp_set *set_local;
  
  if (*replaced == 0) {
    (set->val).nodes[i].node = node;
    (set->val).nodes[i].type = LYXP_NODE_ELEM;
    (set->val).nodes[i].pos = pos;
    *replaced = 1;
  }
  else {
    set_insert_node(set,node,pos,LYXP_NODE_ELEM,i);
  }
  return;
}

Assistant:

static void
moveto_node_add(struct lyxp_set *set, struct lyd_node *node, uint32_t pos, uint32_t i, int *replaced)
{
    if (!(*replaced)) {
        set->val.nodes[i].node = node;
        set->val.nodes[i].type = LYXP_NODE_ELEM;
        set->val.nodes[i].pos = pos;
        *replaced = 1;
    } else {
        set_insert_node(set, node, pos, LYXP_NODE_ELEM, i);
    }
}